

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O3

Writer * __thiscall chatra::Writer::outMethod(Writer *this,Method *method)

{
  Class *cl;
  
  if (method == (Method *)0x0) {
    outRawInteger<int>(this,0);
  }
  else if ((method->super_MethodBase).node == (Node *)0x0) {
    if ((method->super_ArgumentMatcher).args.
        super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (method->super_ArgumentMatcher).args.
        super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      outRawInteger<int>(this,2);
      cl = method->cl;
    }
    else {
      outRawInteger<int>(this,3);
      outClass(this,method->cl);
      cl = ((method->super_ArgumentMatcher).args.
            super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl.
            super__Vector_impl_data._M_start)->cl;
    }
    outClass(this,cl);
  }
  else {
    outRawInteger<int>(this,1);
    outNode(this,(method->super_MethodBase).node);
  }
  return this;
}

Assistant:

Writer& Writer::outMethod(const Method* method) {
	chatra_assert(entityMapEnabled);
	CHATRA_SAVE_TYPE_TAG(Method);

	if (method == nullptr)
		out(0);
	else if (method->node == nullptr) {
		chatra_assert(method->cl != nullptr);

		// default constructor or copy/converting constructor
		if (method->args.empty()) {
			out(2);
			out(method->cl);
		}
		else {
			chatra_assert(method->args.size() == 1);
			out(3);
			out(method->cl);
			out(method->args[0].cl);
		}
	}
	else {
		out(1);
		out(method->node);
	}
	return *this;
}